

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O1

void Abc_FlowRetime_MarkBlocks(Abc_Ntk_t *pNtk)

{
  uint *puVar1;
  uint uVar2;
  Abc_Obj_t *pNode;
  void *pvVar3;
  int iVar4;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  
  if (pManMR->fIsForward == 0) {
    pVVar6 = pNtk->vPis;
    if (0 < pVVar6->nSize) {
      lVar5 = 0;
      do {
        puVar1 = (uint *)((long)pVVar6->pArray[lVar5] + 0x14);
        *puVar1 = *puVar1 | 0x10;
        lVar5 = lVar5 + 1;
        pVVar6 = pNtk->vPis;
      } while (lVar5 < pVVar6->nSize);
    }
    pVVar6 = pNtk->vBoxes;
    if (0 < pVVar6->nSize) {
      lVar5 = 0;
      do {
        uVar2 = *(uint *)((long)pVVar6->pArray[lVar5] + 0x14);
        if ((uVar2 & 0xf) == 8) {
          *(uint *)((long)pVVar6->pArray[lVar5] + 0x14) = uVar2 | 0x10;
        }
        lVar5 = lVar5 + 1;
        pVVar6 = pNtk->vBoxes;
      } while (lVar5 < pVVar6->nSize);
    }
    pVVar6 = pNtk->vPos;
    if (0 < pVVar6->nSize) {
      lVar5 = 0;
      do {
        Abc_NtkMarkCone_rec((Abc_Obj_t *)pVVar6->pArray[lVar5],pManMR->fIsForward);
        lVar5 = lVar5 + 1;
        pVVar6 = pNtk->vPos;
      } while (lVar5 < pVVar6->nSize);
    }
    if ((pManMR->fBlockConst != 0) && (pVVar6 = pNtk->vObjs, 0 < pVVar6->nSize)) {
      lVar5 = 0;
      do {
        pNode = (Abc_Obj_t *)pVVar6->pArray[lVar5];
        if (pNode != (Abc_Obj_t *)0x0) {
          if (pNtk->ntkType == ABC_NTK_STRASH) {
            if (**(int **)((ulong)pNode & 0xfffffffffffffffe) != 3) {
              __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                            ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
            }
            if ((*(uint *)((long)((ulong)pNode & 0xfffffffffffffffe) + 0x14) & 0xf) == 1) {
LAB_004d072e:
              *(ushort *)(pManMR->pDataArray + (uint)pNode->Id) =
                   *(ushort *)(pManMR->pDataArray + (uint)pNode->Id) | 0x10;
            }
          }
          else {
            iVar4 = Abc_NodeIsConst(pNode);
            if (iVar4 != 0) goto LAB_004d072e;
          }
        }
        lVar5 = lVar5 + 1;
        pVVar6 = pNtk->vObjs;
      } while (lVar5 < pVVar6->nSize);
    }
  }
  else {
    pVVar6 = pNtk->vPos;
    if (0 < pVVar6->nSize) {
      lVar5 = 0;
      do {
        puVar1 = (uint *)((long)pVVar6->pArray[lVar5] + 0x14);
        *puVar1 = *puVar1 | 0x10;
        lVar5 = lVar5 + 1;
        pVVar6 = pNtk->vPos;
      } while (lVar5 < pVVar6->nSize);
    }
    pVVar6 = pNtk->vBoxes;
    if (0 < pVVar6->nSize) {
      lVar5 = 0;
      do {
        uVar2 = *(uint *)((long)pVVar6->pArray[lVar5] + 0x14);
        if ((uVar2 & 0xf) == 8) {
          *(uint *)((long)pVVar6->pArray[lVar5] + 0x14) = uVar2 | 0x10;
        }
        lVar5 = lVar5 + 1;
        pVVar6 = pNtk->vBoxes;
      } while (lVar5 < pVVar6->nSize);
    }
    pVVar6 = pNtk->vPis;
    if (0 < pVVar6->nSize) {
      lVar5 = 0;
      do {
        Abc_NtkMarkCone_rec((Abc_Obj_t *)pVVar6->pArray[lVar5],pManMR->fIsForward);
        lVar5 = lVar5 + 1;
        pVVar6 = pNtk->vPis;
      } while (lVar5 < pVVar6->nSize);
    }
  }
  pVVar6 = pNtk->vObjs;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      pvVar3 = pVVar6->pArray[lVar5];
      if (((pvVar3 != (void *)0x0) && (uVar2 = *(uint *)((long)pvVar3 + 0x14), (uVar2 & 0x10) != 0))
         && (*(uint *)((long)pvVar3 + 0x14) = uVar2 & 0xffffffef, (uVar2 & 0xf) != 8)) {
        *(ushort *)(pManMR->pDataArray + *(uint *)((long)pvVar3 + 0x10)) =
             *(ushort *)(pManMR->pDataArray + *(uint *)((long)pvVar3 + 0x10)) | 0x10;
      }
      lVar5 = lVar5 + 1;
      pVVar6 = pNtk->vObjs;
    } while (lVar5 < pVVar6->nSize);
  }
  return;
}

Assistant:

void
Abc_FlowRetime_MarkBlocks( Abc_Ntk_t * pNtk ) {
  int i;
  Abc_Obj_t *pObj;

  if (pManMR->fIsForward){
    // --- forward retiming : block TFO of inputs    

    // mark the frontier
    Abc_NtkForEachPo( pNtk, pObj, i )
      pObj->fMarkA = 1;
    Abc_NtkForEachLatch( pNtk, pObj, i )
      {
        pObj->fMarkA = 1;
      }
    // mark the nodes reachable from the PIs
    Abc_NtkForEachPi( pNtk, pObj, i )
      Abc_NtkMarkCone_rec( pObj, pManMR->fIsForward );
  } else {
    // --- backward retiming : block TFI of outputs

    // mark the frontier
    Abc_NtkForEachPi( pNtk, pObj, i )
      pObj->fMarkA = 1;
    Abc_NtkForEachLatch( pNtk, pObj, i )
      {
        pObj->fMarkA = 1;
      }
    // mark the nodes reachable from the POs
    Abc_NtkForEachPo( pNtk, pObj, i )
      Abc_NtkMarkCone_rec( pObj, pManMR->fIsForward );
    // block constant nodes (if enabled)
    if (pManMR->fBlockConst) {
      Abc_NtkForEachObj( pNtk, pObj, i )
        if ((Abc_NtkIsStrash(pNtk) && Abc_AigNodeIsConst(pObj)) ||
            (!Abc_NtkIsStrash(pNtk) && Abc_NodeIsConst(pObj))) {
          FSET(pObj, BLOCK);
        }
    }
  }

  // copy marks
  Abc_NtkForEachObj( pNtk, pObj, i ) {
    if (pObj->fMarkA) {
      pObj->fMarkA = 0;
      if (!Abc_ObjIsLatch(pObj) /* && !Abc_ObjIsPi(pObj) */ )
        FSET(pObj, BLOCK);
    }
  }
}